

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

Block * google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::MILSpec::Block>
                  (Arena *arena)

{
  Block *this;
  
  if (arena == (Arena *)0x0) {
    this = (Block *)operator_new(0x90);
    CoreML::Specification::MILSpec::Block::Block(this,(Arena *)0x0,false);
  }
  else {
    this = (Block *)AllocateAlignedWithHook
                              (arena,0x90,
                               (type_info *)&CoreML::Specification::MILSpec::Block::typeinfo);
    CoreML::Specification::MILSpec::Block::Block(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }